

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void Id_DsdManTuneStr(If_DsdMan_t *p,char *pStruct,int nConfls,int nProcs,int fVerbose)

{
  Vec_Ptr_t *p_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Ifn_Ntk_t *pIVar6;
  char *pcVar7;
  void *pvVar8;
  Vec_Wrd_t *pVVar9;
  ProgressBar *p_01;
  word *__dest;
  abctime aVar10;
  abctime aVar11;
  int iVar12;
  word extraout_RDX;
  word extraout_RDX_00;
  word Fill;
  word extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  abctime time;
  abctime time_00;
  abctime time_01;
  ulong uVar13;
  Ifn_ThData_t *__arg;
  long lVar14;
  long lVar15;
  ulong uVar16;
  abctime *paVar17;
  char *local_fa78;
  pthread_t WorkerThread [100];
  Ifn_ThData_t ThData [100];
  
  aVar5 = Abc_Clock();
  if (nProcs == 1) {
    Id_DsdManTuneStr1(p,pStruct,nConfls,fVerbose);
    return;
  }
  if (100 < nProcs) {
    printf("The number of processes (%d) exceeds the precompiled limit (%d).\n",(ulong)(uint)nProcs,
           100);
    return;
  }
  pIVar6 = Ifn_NtkParse(pStruct);
  if (pIVar6 != (Ifn_Ntk_t *)0x0) {
    iVar12 = p->nVars;
    iVar2 = Ifn_NtkInputNum(pIVar6);
    if (iVar2 < iVar12) {
      uVar4 = p->nVars;
      uVar3 = Ifn_NtkInputNum(pIVar6);
      printf("The support of DSD manager (%d) exceeds the support of the structure (%d).\n",
             (ulong)uVar4,(ulong)uVar3);
      free(pIVar6);
      return;
    }
    if (p->pCellStr != (char *)0x0) {
      free(p->pCellStr);
      p->pCellStr = (char *)0x0;
    }
    pcVar7 = Abc_UtilStrsav(pStruct);
    p->pCellStr = pcVar7;
    iVar12 = p->nVars;
    iVar2 = Ifn_NtkInputNum(pIVar6);
    if (iVar12 < iVar2) {
      uVar4 = p->nVars;
      uVar3 = Ifn_NtkInputNum(pIVar6);
      printf("Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n"
             ,(ulong)uVar4,(ulong)uVar3);
    }
    uVar4 = Ifn_NtkLutSizeMax(pIVar6);
    uVar3 = Ifn_NtkTtBits(pStruct);
    p->nTtBits = uVar3;
    iVar12 = (((int)uVar3 >> 6) + 1) - (uint)((uVar3 & 0x3f) == 0);
    p->nConfigWords = iVar12 + 1;
    if (9 < iVar12) {
      __assert_fail("p->nConfigWords <= 10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0xa4f,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
    }
    if (fVerbose != 0) {
      printf("Considering programmable cell: ");
      Ifn_NtkPrint(pIVar6);
      printf("Largest LUT size = %d.\n",(ulong)uVar4);
    }
    free(pIVar6);
    Fill = extraout_RDX;
    if (0 < p->nObjsPrev) {
      printf("Starting the tuning process from object %d (out of %d).\n",(ulong)(uint)p->nObjsPrev,
             (ulong)(uint)(p->vObjs).nSize);
      Fill = extraout_RDX_00;
    }
    p_00 = &p->vObjs;
    for (iVar12 = 0; iVar2 = (p->vObjs).nSize, iVar12 < iVar2; iVar12 = iVar12 + 1) {
      pvVar8 = Vec_PtrEntry(p_00,iVar12);
      if (p->nObjsPrev <= iVar12) {
        *(byte *)((long)pvVar8 + 5) = *(byte *)((long)pvVar8 + 5) & 0xfe;
      }
      Fill = extraout_RDX_01;
    }
    iVar2 = iVar2 * p->nConfigWords;
    if (p->vConfigs == (Vec_Wrd_t *)0x0) {
      pVVar9 = Vec_WrdStart(iVar2);
      p->vConfigs = pVVar9;
    }
    else {
      Vec_WrdFillExtra(p->vConfigs,iVar2,Fill);
    }
    p_01 = Extra_ProgressBarStart(_stdout,(p->vObjs).nSize);
    iVar12 = p->nObjsPrev;
    uVar13 = (ulong)(uint)nProcs;
    if (nProcs < 1) {
      uVar13 = 0;
    }
    pcVar7 = extraout_RDX_02;
    __arg = ThData;
    uVar16 = 0;
    while (uVar13 * 8 + 8 != uVar16 + 8) {
      pIVar6 = Ifn_NtkParse(pStruct);
      __arg->pNtk = pIVar6;
      __arg->nVars = -1;
      __arg->Id = -1;
      __arg->nConfls = nConfls;
      __arg->Result = -1;
      __arg->Status = 0;
      __arg->clkUsed = 0;
      __arg->nConfigWords = p->nConfigWords;
      iVar2 = pthread_create((pthread_t *)((long)WorkerThread + uVar16),(pthread_attr_t *)0x0,
                             Ifn_WorkerThread,__arg);
      pcVar7 = extraout_RDX_03;
      __arg = __arg + 1;
      uVar16 = uVar16 + 8;
      if (iVar2 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0xa74,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
      }
    }
    lVar14 = uVar13 * 0x278;
    bVar1 = true;
    local_fa78 = (char *)0x0;
    while ((bVar1 || (iVar12 < (p->vObjs).nSize))) {
      for (lVar15 = 0; lVar14 - lVar15 != 0; lVar15 = lVar15 + 0x278) {
        if (*(int *)((long)ThData[0].pConfig + lVar15 + 100) == 0) {
          iVar2 = *(int *)((long)ThData[0].pConfig + lVar15 + 0x58);
          if (-1 < iVar2) {
            uVar4 = *(uint *)((long)ThData[0].pConfig + lVar15 + 0x60);
            if (1 < uVar4) {
              __assert_fail("ThData[i].Result == 0 || ThData[i].Result == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                            ,0xa81,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
            }
            if (uVar4 == 0) {
              If_DsdVecObjSetMark(p_00,iVar2);
              pcVar7 = extraout_RDX_05;
            }
            else {
              __dest = Vec_WrdEntryP(p->vConfigs,iVar2 * p->nConfigWords);
              memcpy(__dest,(void *)((long)ThData[0].pConfig + lVar15),(long)p->nConfigWords << 3);
              pcVar7 = extraout_RDX_04;
            }
            *(undefined4 *)((long)ThData[0].pConfig + lVar15 + 0x58) = 0xffffffff;
            *(undefined4 *)((long)ThData[0].pConfig + lVar15 + 0x60) = 0xffffffff;
          }
          if (iVar12 < (p->vObjs).nSize) {
            if ((char)iVar12 == '\0') {
              Extra_ProgressBarUpdate(p_01,iVar12,pcVar7);
            }
            pvVar8 = Vec_PtrEntry(p_00,iVar12);
            uVar4 = *(uint *)((long)pvVar8 + 4);
            aVar10 = Abc_Clock();
            iVar2 = Abc_Var2Lit(iVar12,0);
            If_DsdManComputeTruthPtr(p,iVar2,(uchar *)0x0,(word *)((long)ThData[0].pTruth + lVar15))
            ;
            aVar11 = Abc_Clock();
            local_fa78 = local_fa78 + (aVar11 - aVar10);
            *(uint *)((long)ThData[0].pConfig + lVar15 + 0x54) = uVar4 >> 3 & 0x1f;
            *(int *)((long)ThData[0].pConfig + lVar15 + 0x58) = iVar12;
            *(undefined8 *)((long)ThData[0].pConfig + lVar15 + 0x60) = 0x1ffffffff;
            iVar12 = iVar12 + 1;
            pcVar7 = extraout_RDX_06;
          }
        }
      }
      bVar1 = false;
      for (lVar15 = 0; lVar14 - lVar15 != 0; lVar15 = lVar15 + 0x278) {
        uVar4 = *(uint *)((long)ThData[0].pConfig + lVar15 + 100);
        pcVar7 = (char *)(ulong)uVar4;
        if ((uVar4 == 1) ||
           ((uVar4 == 0 && (-1 < *(int *)((long)ThData[0].pConfig + lVar15 + 0x58))))) {
          bVar1 = true;
        }
      }
    }
    for (lVar15 = 0; lVar14 - lVar15 != 0; lVar15 = lVar15 + 0x278) {
      if (*(int *)((long)ThData[0].pConfig + lVar15 + 100) != 0) {
        __assert_fail("ThData[i].Status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0xaa9,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
      }
      *(undefined4 *)((long)ThData[0].pConfig + lVar15 + 0x58) = 0xffffffff;
      *(undefined4 *)((long)ThData[0].pConfig + lVar15 + 100) = 1;
      pvVar8 = *(void **)((long)ThData[0].pTruth + lVar15 + -8);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)((long)ThData[0].pTruth + lVar15 + -8) = 0;
      }
    }
    if (fVerbose != 0) {
      printf("Main     : ");
      Abc_PrintTime(0x816bba,local_fa78,time);
      paVar17 = &ThData[0].clkUsed;
      for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
        printf("Thread %d : ",uVar16 & 0xffffffff);
        Abc_PrintTime(0x816bba,(char *)*paVar17,time_00);
        paVar17 = paVar17 + 0x4f;
      }
    }
    p->nObjsPrev = 0;
    p->LutSize = 0;
    Extra_ProgressBarStop(p_01);
    printf("Finished matching %d functions. ",(ulong)(uint)(p->vObjs).nSize);
    aVar10 = Abc_Clock();
    Abc_PrintTime(0x816bba,(char *)(aVar10 - aVar5),time_01);
  }
  return;
}

Assistant:

void Id_DsdManTuneStr( If_DsdMan_t * p, char * pStruct, int nConfls, int nProcs, int fVerbose )
{
    int fVeryVerbose = 0;
    ProgressBar * pProgress = NULL;
    int i, k, nVars, LutSize;
    abctime clk = Abc_Clock();
    Ifn_Ntk_t * pNtk;
    If_DsdObj_t * pObj;
    if ( nProcs == 1 )
    {
        Id_DsdManTuneStr1( p, pStruct, nConfls, fVerbose );
        return;
    }
    if ( nProcs > PAR_THR_MAX )
    {
        printf( "The number of processes (%d) exceeds the precompiled limit (%d).\n", nProcs, PAR_THR_MAX );
        return;
    }
    // parse the structure
    pNtk = Ifn_NtkParse( pStruct );
    if ( pNtk == NULL )
        return;
    if ( If_DsdManVarNum(p) > Ifn_NtkInputNum(pNtk) )
    {
        printf( "The support of DSD manager (%d) exceeds the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
        ABC_FREE( pNtk );
        return;
    }
    ABC_FREE( p->pCellStr );
    p->pCellStr = Abc_UtilStrsav( pStruct );
    if ( If_DsdManVarNum(p) < Ifn_NtkInputNum(pNtk) )
        printf( "Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
    // check the largest LUT
    LutSize = Ifn_NtkLutSizeMax(pNtk);
    p->nTtBits = Ifn_NtkTtBits( pStruct );
    p->nConfigWords = 1 + Abc_Bit6WordNum( p->nTtBits );
    assert( p->nConfigWords <= 10 );
    if ( fVerbose )
    {
        printf( "Considering programmable cell: " );
        Ifn_NtkPrint( pNtk );
        printf( "Largest LUT size = %d.\n", LutSize );
    }
    ABC_FREE( pNtk );
    if ( p->nObjsPrev > 0 )
        printf( "Starting the tuning process from object %d (out of %d).\n", p->nObjsPrev, Vec_PtrSize(&p->vObjs) );
    // clean the attributes
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( i >= p->nObjsPrev )
            pObj->fMark = 0;
    if ( p->vConfigs == NULL )
        p->vConfigs = Vec_WrdStart( p->nConfigWords * Vec_PtrSize(&p->vObjs) );
    else
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs), 0 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );

    // perform concurrent solving
    {
        pthread_t WorkerThread[PAR_THR_MAX];
        Ifn_ThData_t ThData[PAR_THR_MAX];
        abctime clk, clkUsed = 0;
        int status, fRunning = 1, iCurrentObj = p->nObjsPrev;
        // start the threads
        for ( i = 0; i < nProcs; i++ )
        {
            ThData[i].pNtk     = Ifn_NtkParse( pStruct );
            ThData[i].nVars    = -1;      // support
            ThData[i].Id       = -1;      // object
            ThData[i].nConfls  = nConfls; // conflicts
            ThData[i].Result   = -1;      // result
            ThData[i].Status   =  0;      // state
            ThData[i].clkUsed  =  0;      // total runtime
            ThData[i].nConfigWords = p->nConfigWords;
            status = pthread_create( WorkerThread + i, NULL, Ifn_WorkerThread, (void *)(ThData + i) );  assert( status == 0 );
        }
        // run the threads
        while ( fRunning || iCurrentObj < Vec_PtrSize(&p->vObjs) )
        {
            for ( i = 0; i < nProcs; i++ )
            {
                if ( ThData[i].Status )
                    continue;
                assert( ThData[i].Status == 0 );
                if ( ThData[i].Id >= 0 )
                {
                    //printf( "Closing obj %d with Thread %d:\n", ThData[i].Id, i );
                    assert( ThData[i].Result == 0 || ThData[i].Result == 1 );
                    if ( ThData[i].Result == 0 )
                        If_DsdVecObjSetMark( &p->vObjs, ThData[i].Id );
                    else
                    {
                        word * pTtWords = Vec_WrdEntryP( p->vConfigs, p->nConfigWords * ThData[i].Id );
                        memcpy( pTtWords, ThData[i].pConfig, sizeof(word) * p->nConfigWords );
                    }
                    ThData[i].Id     = -1;
                    ThData[i].Result = -1;
                }
                for ( k = iCurrentObj; k < Vec_PtrSize(&p->vObjs); k++ )
                {
                    if ( (k & 0xFF) == 0 )
                        Extra_ProgressBarUpdate( pProgress, k, NULL );
                    pObj  = If_DsdVecObj( &p->vObjs, k );
                    nVars = If_DsdObjSuppSize(pObj);
                    //if ( nVars <= LutSize )
                    //    continue;
                    clk = Abc_Clock();
                    If_DsdManComputeTruthPtr( p, Abc_Var2Lit(k, 0), NULL, ThData[i].pTruth );
                    clkUsed += Abc_Clock() - clk;
                    ThData[i].nVars  = nVars;
                    ThData[i].Id     =  k;
                    ThData[i].Result = -1;
                    ThData[i].Status =  1;
                    //printf( "Scheduling %d for Thread %d\n", ThData[i].Id, i );
                    iCurrentObj = k+1;
                    break;
                }
            }
            fRunning = 0;
            for ( i = 0; i < nProcs; i++ )
                if ( ThData[i].Status == 1 || (ThData[i].Status == 0 && ThData[i].Id >= 0) )
                    fRunning = 1;
            //printf( "fRunning %d\n", fRunning );
        }
        // stop the threads
        for ( i = 0; i < nProcs; i++ )
        {
            assert( ThData[i].Status == 0 );
            ThData[i].Id = -1;
            ThData[i].Status = 1;
            ABC_FREE( ThData[i].pNtk );
        }
        if ( fVerbose )
        {
            printf( "Main     : " );
            Abc_PrintTime( 1, "Time", clkUsed );
            for ( i = 0; i < nProcs; i++ )
            {
                printf( "Thread %d : ", i );
                Abc_PrintTime( 1, "Time", ThData[i].clkUsed );
            }
        }
    }

    p->nObjsPrev = 0;
    p->LutSize = 0;
    Extra_ProgressBarStop( pProgress );
    printf( "Finished matching %d functions. ", Vec_PtrSize(&p->vObjs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        If_DsdManPrintDistrib( p );
}